

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O3

ExchangeRequests * __thiscall
adios2::aggregator::MPIChain::IExchange
          (ExchangeRequests *__return_storage_ptr__,MPIChain *this,Buffer *buffer,int step)

{
  size_t *count;
  size_t sVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  long *plVar6;
  undefined4 extraout_var;
  undefined8 *puVar7;
  long *plVar8;
  undefined4 extraout_var_00;
  uint uVar9;
  uint uVar10;
  CommImpl *pCVar11;
  size_type *psVar12;
  ulong uVar13;
  ulong uVar14;
  uint __uval_1;
  char cVar15;
  MPIChain *pMVar16;
  int iVar17;
  uint __uval;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  string __str_2;
  string __str;
  string __str_1;
  Req receiveSizeRequest;
  size_t bufferSize;
  undefined1 local_130 [32];
  _Head_base<0UL,_adios2::helper::CommImpl_*,_false> local_110;
  long local_108;
  CommImpl local_100;
  pointer puStack_f8;
  _Head_base<0UL,_adios2::format::Buffer_*,_false> local_f0;
  MPIChain *local_e8;
  ExchangeRequests *local_e0;
  _Head_base<0UL,_adios2::helper::CommImpl_*,_false> local_d8 [2];
  CommImpl local_c8 [2];
  Comm *local_b8;
  _Head_base<0UL,_adios2::format::Buffer_*,_false> local_b0;
  size_t local_a8;
  Comm local_a0;
  ulong local_98;
  Req *local_90;
  size_t local_88;
  Comm *local_80;
  ulong local_78;
  Req *local_70;
  Status local_68;
  string local_50;
  
  iVar17 = (this->super_MPIAggregator).m_Size;
  if (iVar17 == 1) {
    helper::Comm::Req::Req(&__return_storage_ptr__->m_SendSize);
    helper::Comm::Req::Req(&__return_storage_ptr__->m_SendData);
    helper::Comm::Req::Req(&__return_storage_ptr__->m_RecvData);
  }
  else {
    local_f0._M_head_impl = buffer;
    if (this->m_CurrentBufferOrder != 0) {
      local_f0._M_head_impl =
           *(Buffer **)
            &(((this->super_MPIAggregator).m_Buffers.
               super__Vector_base<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>,_std::allocator<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>
             ._M_t;
    }
    iVar17 = iVar17 + ~step;
    iVar5 = (this->super_MPIAggregator).m_Rank;
    local_a8 = CONCAT44(local_a8._4_4_,iVar5);
    local_b0._M_head_impl = buffer;
    helper::Comm::Req::Req(&__return_storage_ptr__->m_SendSize);
    local_90 = &__return_storage_ptr__->m_SendData;
    helper::Comm::Req::Req(local_90);
    local_70 = &__return_storage_ptr__->m_RecvData;
    local_e8 = this;
    local_b8 = (Comm *)(ulong)(uint)step;
    helper::Comm::Req::Req(local_70);
    local_e0 = __return_storage_ptr__;
    if (0 < iVar5 && iVar5 <= iVar17) {
      uVar20 = (uint)local_b8;
      uVar18 = -uVar20;
      if (0 < (int)uVar20) {
        uVar18 = uVar20;
      }
      uVar19 = 1;
      if (9 < uVar18) {
        uVar14 = (ulong)uVar18;
        uVar10 = 4;
        do {
          uVar19 = uVar10;
          uVar9 = (uint)uVar14;
          if (uVar9 < 100) {
            uVar19 = uVar19 - 2;
            goto LAB_00643395;
          }
          if (uVar9 < 1000) {
            uVar19 = uVar19 - 1;
            goto LAB_00643395;
          }
          if (uVar9 < 10000) goto LAB_00643395;
          uVar14 = uVar14 / 10000;
          uVar10 = uVar19 + 4;
        } while (99999 < uVar9);
        uVar19 = uVar19 + 1;
      }
LAB_00643395:
      iVar5 = (local_e8->super_MPIAggregator).m_Rank;
      cVar3 = (char)((ulong)local_b8 >> 0x18) >> 7;
      local_d8[0]._M_head_impl = local_c8;
      std::__cxx11::string::_M_construct((ulong)local_d8,(char)uVar19 - cVar3);
      local_78 = (ulong)(uVar20 >> 0x1f);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)&(local_d8[0]._M_head_impl)->_vptr_CommImpl + local_78),uVar19,
                 uVar18);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x74f5c1);
      pCVar11 = (CommImpl *)(plVar6 + 2);
      if ((CommImpl *)*plVar6 == pCVar11) {
        local_100._vptr_CommImpl = pCVar11->_vptr_CommImpl;
        puStack_f8 = (pointer)plVar6[3];
        local_110._M_head_impl = &local_100;
      }
      else {
        local_100._vptr_CommImpl = pCVar11->_vptr_CommImpl;
        local_110._M_head_impl = (CommImpl *)*plVar6;
      }
      local_108 = plVar6[1];
      *plVar6 = (long)pCVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_80 = &(local_e8->super_MPIAggregator).m_Comm;
      count = &(local_f0._M_head_impl)->m_Position;
      local_130._0_8_ = local_130 + 0x10;
      psVar12 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar12) {
        local_130._16_8_ = *psVar12;
        local_130._24_8_ = plVar6[3];
      }
      else {
        local_130._16_8_ = *psVar12;
        local_130._0_8_ = (size_type *)*plVar6;
      }
      local_130._8_8_ = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      helper::Comm::Isend<unsigned_long>
                ((Comm *)&local_68,(unsigned_long *)local_80,(size_t)count,1,iVar5 + -1,
                 (string *)0x0);
      helper::Comm::Req::operator=(&local_e0->m_SendSize,(Req *)&local_68);
      helper::Comm::Req::~Req((Req *)&local_68);
      if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
        operator_delete((void *)local_130._0_8_);
      }
      if (local_110._M_head_impl != &local_100) {
        operator_delete(local_110._M_head_impl);
      }
      if (local_d8[0]._M_head_impl != local_c8) {
        operator_delete(local_d8[0]._M_head_impl);
      }
      __return_storage_ptr__ = local_e0;
      if (*count != 0) {
        iVar5 = (*(local_f0._M_head_impl)->_vptr_Buffer[2])();
        local_88 = CONCAT44(extraout_var,iVar5);
        uVar20 = 1;
        if (9 < uVar18) {
          uVar14 = (ulong)uVar18;
          uVar19 = 4;
          do {
            uVar20 = uVar19;
            uVar10 = (uint)uVar14;
            if (uVar10 < 100) {
              uVar20 = uVar20 - 2;
              goto LAB_006435a0;
            }
            if (uVar10 < 1000) {
              uVar20 = uVar20 - 1;
              goto LAB_006435a0;
            }
            if (uVar10 < 10000) goto LAB_006435a0;
            uVar14 = uVar14 / 10000;
            uVar19 = uVar20 + 4;
          } while (99999 < uVar10);
          uVar20 = uVar20 + 1;
        }
LAB_006435a0:
        iVar5 = (local_e8->super_MPIAggregator).m_Rank;
        sVar1 = (local_f0._M_head_impl)->m_Position;
        local_110._M_head_impl = &local_100;
        std::__cxx11::string::_M_construct((ulong)&local_110,(char)uVar20 - cVar3);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)&(local_110._M_head_impl)->_vptr_CommImpl + local_78),uVar20,
                   uVar18);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x74f5e8);
        __return_storage_ptr__ = local_e0;
        psVar12 = puVar7 + 2;
        if ((size_type *)*puVar7 == psVar12) {
          local_130._16_8_ = *psVar12;
          local_130._24_8_ = puVar7[3];
          local_130._0_8_ = local_130 + 0x10;
        }
        else {
          local_130._16_8_ = *psVar12;
          local_130._0_8_ = (size_type *)*puVar7;
        }
        local_130._8_8_ = puVar7[1];
        *puVar7 = psVar12;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        helper::Comm::Isend<char>
                  ((Comm *)local_d8,(char *)local_80,local_88,(int)sVar1,iVar5 + -1,(string *)0x1);
        helper::Comm::Req::operator=(local_90,(Req *)local_d8);
        helper::Comm::Req::~Req((Req *)local_d8);
        if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
          operator_delete((void *)local_130._0_8_);
        }
        if (local_110._M_head_impl != &local_100) {
          operator_delete(local_110._M_head_impl);
        }
      }
    }
    if ((int)local_a8 < iVar17) {
      local_98 = 0;
      uVar20 = (uint)local_b8;
      uVar18 = -uVar20;
      if (0 < (int)uVar20) {
        uVar18 = uVar20;
      }
      uVar19 = 1;
      if (9 < uVar18) {
        uVar14 = (ulong)uVar18;
        uVar10 = 4;
        do {
          uVar19 = uVar10;
          uVar9 = (uint)uVar14;
          if (uVar9 < 100) {
            uVar19 = uVar19 - 2;
            goto LAB_00643742;
          }
          if (uVar9 < 1000) {
            uVar19 = uVar19 - 1;
            goto LAB_00643742;
          }
          if (uVar9 < 10000) goto LAB_00643742;
          uVar14 = uVar14 / 10000;
          uVar10 = uVar19 + 4;
        } while (99999 < uVar9);
        uVar19 = uVar19 + 1;
      }
LAB_00643742:
      iVar17 = (local_e8->super_MPIAggregator).m_Rank;
      cVar3 = (char)-((int)uVar20 >> 0x1f);
      local_d8[0]._M_head_impl = local_c8;
      std::__cxx11::string::_M_construct((ulong)local_d8,(char)uVar19 + cVar3);
      local_f0._M_head_impl = (Buffer *)(ulong)(uint)-((int)uVar20 >> 0x1f);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)&(((pointer)local_f0._M_head_impl)->_M_t).
                                 super___uniq_ptr_impl<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_adios2::format::Buffer_*,_std::default_delete<adios2::format::Buffer>_>
                                 .super__Head_base<0UL,_adios2::format::Buffer_*,_false>.
                                 _M_head_impl + (long)local_d8[0]._M_head_impl),uVar19,uVar18);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x74f60f);
      pMVar16 = local_e8;
      pCVar11 = (CommImpl *)(plVar6 + 2);
      if ((CommImpl *)*plVar6 == pCVar11) {
        local_100._vptr_CommImpl = pCVar11->_vptr_CommImpl;
        puStack_f8 = (pointer)plVar6[3];
        local_110._M_head_impl = &local_100;
      }
      else {
        local_100._vptr_CommImpl = pCVar11->_vptr_CommImpl;
        local_110._M_head_impl = (CommImpl *)*plVar6;
      }
      local_108 = plVar6[1];
      *plVar6 = (long)pCVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_b8 = &(pMVar16->super_MPIAggregator).m_Comm;
      local_130._0_8_ = local_130 + 0x10;
      psVar12 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar12) {
        local_130._16_8_ = *psVar12;
        local_130._24_8_ = plVar6[3];
      }
      else {
        local_130._16_8_ = *psVar12;
        local_130._0_8_ = (size_type *)*plVar6;
      }
      local_130._8_8_ = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      helper::Comm::Irecv<unsigned_long>
                (&local_a0,(unsigned_long *)local_b8,(size_t)&local_98,1,iVar17 + 1,(string *)0x0);
      if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
        operator_delete((void *)local_130._0_8_);
      }
      if (local_110._M_head_impl != &local_100) {
        operator_delete(local_110._M_head_impl);
      }
      if (local_d8[0]._M_head_impl != local_c8) {
        operator_delete(local_d8[0]._M_head_impl);
      }
      uVar20 = 1;
      if (9 < uVar18) {
        uVar14 = (ulong)uVar18;
        uVar19 = 4;
        do {
          uVar20 = uVar19;
          uVar10 = (uint)uVar14;
          if (uVar10 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_006438f3;
          }
          if (uVar10 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_006438f3;
          }
          if (uVar10 < 10000) goto LAB_006438f3;
          uVar14 = uVar14 / 10000;
          uVar19 = uVar20 + 4;
        } while (99999 < uVar10);
        uVar20 = uVar20 + 1;
      }
LAB_006438f3:
      local_d8[0]._M_head_impl = local_c8;
      std::__cxx11::string::_M_construct((ulong)local_d8,(char)uVar20 + cVar3);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)&(((__uniq_ptr_data<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>,_true,_true>
                                    *)&(local_f0._M_head_impl)->_vptr_Buffer)->
                                 super___uniq_ptr_impl<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>
                                 )._M_t.
                                 super__Tuple_impl<0UL,_adios2::format::Buffer_*,_std::default_delete<adios2::format::Buffer>_>
                                 .super__Head_base<0UL,_adios2::format::Buffer_*,_false>.
                                 _M_head_impl + (long)local_d8[0]._M_head_impl),uVar20,uVar18);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x74f636);
      pCVar11 = (CommImpl *)(plVar8 + 2);
      plVar6 = (long *)(local_130 + 0x10);
      if ((CommImpl *)*plVar8 == pCVar11) {
        local_100._vptr_CommImpl = pCVar11->_vptr_CommImpl;
        puStack_f8 = (pointer)plVar8[3];
        local_110._M_head_impl = &local_100;
      }
      else {
        local_100._vptr_CommImpl = pCVar11->_vptr_CommImpl;
        local_110._M_head_impl = (CommImpl *)*plVar8;
      }
      local_108 = plVar8[1];
      *plVar8 = (long)pCVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
      psVar12 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar12) {
        local_130._16_8_ = *psVar12;
        local_130._24_8_ = plVar8[3];
        local_130._0_8_ = plVar6;
      }
      else {
        local_130._16_8_ = *psVar12;
        local_130._0_8_ = (size_type *)*plVar8;
      }
      local_130._8_8_ = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      helper::Comm::Req::Wait(&local_68,(Req *)&local_a0,(string *)local_130);
      if ((long *)local_130._0_8_ != plVar6) {
        operator_delete((void *)local_130._0_8_);
      }
      if (local_110._M_head_impl != &local_100) {
        operator_delete(local_110._M_head_impl);
      }
      if (local_d8[0]._M_head_impl != local_c8) {
        operator_delete(local_d8[0]._M_head_impl);
      }
      uVar14 = local_98;
      if (pMVar16->m_CurrentBufferOrder == 0) {
        local_b0._M_head_impl =
             *(Buffer **)
              &(((pMVar16->super_MPIAggregator).m_Buffers.
                 super__Vector_base<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>,_std::allocator<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>
               ._M_t;
      }
      cVar15 = '\x01';
      if (9 < local_98) {
        uVar13 = local_98;
        cVar4 = '\x04';
        do {
          cVar15 = cVar4;
          if (uVar13 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_00643a93;
          }
          if (uVar13 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_00643a93;
          }
          if (uVar13 < 10000) goto LAB_00643a93;
          bVar2 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          cVar4 = cVar15 + '\x04';
        } while (bVar2);
        cVar15 = cVar15 + '\x01';
      }
LAB_00643a93:
      local_130._0_8_ = plVar6;
      std::__cxx11::string::_M_construct((ulong)local_130,cVar15);
      pMVar16 = (MPIChain *)local_130;
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_130._0_8_,local_130._8_4_,uVar14);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)pMVar16,0,(char *)0x0,0x74f66c);
      psVar12 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_50.field_2._M_allocated_capacity = *psVar12;
        local_50.field_2._8_8_ = plVar6[3];
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar12;
        local_50._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_50._M_string_length = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      ResizeUpdateBuffer(pMVar16,uVar14,local_b0._M_head_impl,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      __return_storage_ptr__ = local_e0;
      if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
        operator_delete((void *)local_130._0_8_);
      }
      if (local_98 != 0) {
        iVar17 = (*(local_b0._M_head_impl)->_vptr_Buffer[2])();
        local_a8 = CONCAT44(extraout_var_00,iVar17);
        uVar20 = 1;
        if (9 < uVar18) {
          uVar14 = (ulong)uVar18;
          uVar19 = 4;
          do {
            uVar20 = uVar19;
            uVar10 = (uint)uVar14;
            if (uVar10 < 100) {
              uVar20 = uVar20 - 2;
              goto LAB_00643bda;
            }
            if (uVar10 < 1000) {
              uVar20 = uVar20 - 1;
              goto LAB_00643bda;
            }
            if (uVar10 < 10000) goto LAB_00643bda;
            uVar14 = uVar14 / 10000;
            uVar19 = uVar20 + 4;
          } while (99999 < uVar10);
          uVar20 = uVar20 + 1;
        }
LAB_00643bda:
        iVar17 = (local_e8->super_MPIAggregator).m_Rank;
        sVar1 = (local_b0._M_head_impl)->m_Position;
        local_110._M_head_impl = &local_100;
        std::__cxx11::string::_M_construct((ulong)&local_110,cVar3 + (char)uVar20);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)&(((__uniq_ptr_data<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>,_true,_true>
                                      *)&(local_f0._M_head_impl)->_vptr_Buffer)->
                                   super___uniq_ptr_impl<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>
                                   )._M_t.
                                   super__Tuple_impl<0UL,_adios2::format::Buffer_*,_std::default_delete<adios2::format::Buffer>_>
                                   .super__Head_base<0UL,_adios2::format::Buffer_*,_false>.
                                   _M_head_impl + (long)local_110._M_head_impl),uVar20,uVar18);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x74f6a4);
        local_130._0_8_ = local_130 + 0x10;
        psVar12 = puVar7 + 2;
        if ((size_type *)*puVar7 == psVar12) {
          local_130._16_8_ = *psVar12;
          local_130._24_8_ = puVar7[3];
        }
        else {
          local_130._16_8_ = *psVar12;
          local_130._0_8_ = (size_type *)*puVar7;
        }
        local_130._8_8_ = puVar7[1];
        *puVar7 = psVar12;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        helper::Comm::Irecv<char>
                  ((Comm *)local_d8,(char *)local_b8,local_a8,(int)sVar1,iVar17 + 1,(string *)0x1);
        __return_storage_ptr__ = local_e0;
        helper::Comm::Req::operator=(local_70,(Req *)local_d8);
        helper::Comm::Req::~Req((Req *)local_d8);
        if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
          operator_delete((void *)local_130._0_8_);
        }
        if (local_110._M_head_impl != &local_100) {
          operator_delete(local_110._M_head_impl);
        }
      }
      helper::Comm::Req::~Req((Req *)&local_a0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MPIChain::ExchangeRequests MPIChain::IExchange(format::Buffer &buffer, const int step)
{
    if (m_Size == 1)
    {
        return {};
    }

    format::Buffer &sendBuffer = GetSender(buffer);
    const int endRank = m_Size - 1 - step;
    const bool sender = (m_Rank >= 1 && m_Rank <= endRank) ? true : false;
    const bool receiver = (m_Rank < endRank) ? true : false;

    ExchangeRequests requests;

    if (sender) // sender
    {
        requests.m_SendSize =
            m_Comm.Isend(&sendBuffer.m_Position, 1, m_Rank - 1, 0,
                         ", aggregation Isend size at iteration " + std::to_string(step) + "\n");

        // only send data if buffer larger than 0
        if (sendBuffer.m_Position > 0)
        {
            requests.m_SendData =
                m_Comm.Isend(sendBuffer.Data(), sendBuffer.m_Position, m_Rank - 1, 1,
                             ", aggregation Isend data at iteration " + std::to_string(step));
        }
    }
    // receive size, resize receiving buffer and receive data
    if (receiver)
    {
        size_t bufferSize = 0;
        helper::Comm::Req receiveSizeRequest =
            m_Comm.Irecv(&bufferSize, 1, m_Rank + 1, 0,
                         ", aggregation Irecv size at iteration " + std::to_string(step) + "\n");

        receiveSizeRequest.Wait(", aggregation waiting for receiver size at iteration " +
                                std::to_string(step) + "\n");

        format::Buffer &receiveBuffer = GetReceiver(buffer);
        ResizeUpdateBuffer(bufferSize, receiveBuffer,
                           "in aggregation, when resizing receiving buffer to size " +
                               std::to_string(bufferSize));

        // only receive data if buffer is larger than 0
        if (bufferSize > 0)
        {
            requests.m_RecvData =
                m_Comm.Irecv(receiveBuffer.Data(), receiveBuffer.m_Position, m_Rank + 1, 1,
                             ", aggregation Irecv data at iteration " + std::to_string(step));
        }
    }

    return requests;
}